

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot_playground.cpp
# Opt level: O2

fsm_def * fsm_from_file(fsm_def *__return_storage_ptr__,path *input_file_path)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  string transistions_chunk;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream file;
  byte abStack_218 [488];
  
  fsm_def::fsm_def(__return_storage_ptr__);
  std::ifstream::ifstream(&file,(string *)input_file_path,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Unable to open file: ");
    poVar4 = std::operator<<(poVar4,(string *)input_file_path);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Reading statemachine from: ");
  poVar4 = std::operator<<(poVar4,(string *)input_file_path);
  std::endl<char,std::char_traits<char>>(poVar4);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transistions_chunk,"",(allocator<char> *)&local_278);
  bVar1 = false;
LAB_00105951:
  do {
    while( true ) {
      if ((abStack_218[*(long *)(_file + -0x18)] & 2) != 0) {
        std::__cxx11::string::~string((string *)&transistions_chunk);
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&file);
        return __return_storage_ptr__;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&file,(string *)&line);
      std::locale::locale((locale *)&local_278);
      boost::algorithm::trim<std::__cxx11::string>(&line,(locale *)&local_278);
      std::locale::~locale((locale *)&local_278);
      bVar3 = boost::algorithm::contains<std::__cxx11::string,char[18],boost::algorithm::is_equal>
                        (&line,".transitions_from");
      if (bVar3) goto LAB_00105a87;
      bVar3 = boost::algorithm::contains<std::__cxx11::string,char[17],boost::algorithm::is_equal>
                        (&line,".end_transitions");
      if ((!bVar3) &&
         (bVar3 = boost::algorithm::
                  contains<std::__cxx11::string,char[16],boost::algorithm::is_equal>
                            (&line,".otherwise_loop"), !bVar3)) break;
      if (line._M_string_length != 0) {
        std::operator+(&local_278,&line,"\n");
        std::__cxx11::string::append((string *)&transistions_chunk);
        std::__cxx11::string::~string((string *)&local_278);
      }
LAB_00105a0b:
      if (transistions_chunk._M_string_length != 0) {
        std::operator+(&local_258,"   ",&transistions_chunk);
        std::operator+(&local_278,&local_258,"  ;");
        std::__cxx11::string::operator=((string *)&transistions_chunk,(string *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_258);
        parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (__return_storage_ptr__,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )transistions_chunk._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(transistions_chunk._M_dataplus._M_p + transistions_chunk._M_string_length));
      }
      transistions_chunk._M_string_length = 0;
      *transistions_chunk._M_dataplus._M_p = '\0';
      bVar1 = false;
    }
    if (line._M_string_length == 0) goto LAB_00105a0b;
  } while (!bVar1);
  goto LAB_00105b0f;
LAB_00105a87:
  if (bVar1) {
    if (transistions_chunk._M_string_length != 0) {
      std::operator+(&local_258,"   ",&transistions_chunk);
      std::operator+(&local_278,&local_258,"  ;");
      std::__cxx11::string::operator=((string *)&transistions_chunk,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (__return_storage_ptr__,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )transistions_chunk._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(transistions_chunk._M_dataplus._M_p + transistions_chunk._M_string_length));
    }
    transistions_chunk._M_string_length = 0;
    *transistions_chunk._M_dataplus._M_p = '\0';
  }
  bVar1 = true;
  if (line._M_string_length != 0) {
LAB_00105b0f:
    std::operator+(&local_278,&line,"\n");
    std::__cxx11::string::append((string *)&transistions_chunk);
    std::__cxx11::string::~string((string *)&local_278);
  }
  goto LAB_00105951;
}

Assistant:

fsm_def fsm_from_file(const boost::filesystem::path& input_file_path)
{
    namespace ba = boost::algorithm;
    fsm_def sm;
    std::ifstream file (input_file_path.native());
    if (file.is_open()) {
        std::cout << "Reading statemachine from: " << input_file_path.native() << std::endl;
        std::string line;
        std::string transistions_chunk ("");
        bool in_transistions_chunk = false;
        while (!file.eof()) {
            std::getline(file, line);
            boost::algorithm::trim(line);
            if (ba::contains(line, ".transitions_from")) {
                if (in_transistions_chunk) {
                    if (!transistions_chunk.empty()) {
                        transistions_chunk = "   " + transistions_chunk + "  ;";
//                        std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                        parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                    }
                    transistions_chunk.clear();
                }
                in_transistions_chunk = true;
            }
            else if ( ba::contains(line, ".end_transitions") ||
                 ba::contains(line, ".otherwise_loop") ||
                 line.empty()
               ) {
                in_transistions_chunk = false;
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
                if (!transistions_chunk.empty()) {
                    transistions_chunk = "   " + transistions_chunk + "  ;";
//                    std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                    parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                }
                transistions_chunk.clear();
            }
            if (in_transistions_chunk) {
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
            }
        }
    }
    else {
        std::cout << "Unable to open file: " << input_file_path.native() << std::endl;
        exit(1);
    }

    return sm;
}